

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O0

void anon_unknown.dwarf_14b0b0::readImage(char *inFileName)

{
  int iVar1;
  ostream *__a;
  ostream *this;
  Header *pHVar2;
  Array2D<Imf_3_2::Rgba> *this_00;
  Rgba *pRVar3;
  char *in_RDI;
  AcesInputFile in;
  int height;
  int width;
  Box2i dw;
  Header h;
  Array2D<Imf_3_2::Rgba> p;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffef8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff00;
  Vec2<float> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [8];
  long in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff60;
  Rgba local_98 [2];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  Vec2<float> local_60;
  Header local_58 [56];
  Array2D<Imf_3_2::Rgba> local_20;
  char *local_8;
  
  local_8 = in_RDI;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&local_20);
  this_01 = &local_60;
  Imath_3_2::Vec2<float>::Vec2(this_01,0.0,0.0);
  Imf_3_2::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)this_01,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffff00);
  __a = std::operator<<((ostream *)&std::cout,"Reading file ");
  this = std::operator<<(__a,local_8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)this_01,(allocator<char> *)__a);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::AcesInputFile::AcesInputFile((AcesInputFile *)local_98,local_b8,iVar1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  pHVar2 = (Header *)Imf_3_2::AcesInputFile::header();
  Imf_3_2::Header::operator=(local_58,pHVar2);
  this_00 = (Array2D<Imf_3_2::Rgba> *)Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)this_00,in_stack_fffffffffffffef8);
  local_80 = (local_74 - local_7c) + 1;
  local_84 = (local_70 - local_78) + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_20,0);
  Imf_3_2::AcesInputFile::setFrameBuffer
            (local_98,(ulong)(pRVar3 + (-(long)local_7c - (long)(local_78 * local_80))),1);
  Imf_3_2::AcesInputFile::readPixels((int)local_98,local_78);
  Imf_3_2::AcesInputFile::~AcesInputFile((AcesInputFile *)local_98);
  Imf_3_2::Header::~Header(local_58);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(this_00);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
    Array2D<Rgba> p;
    Header        h;
    Box2i         dw;
    int           width;
    int           height;

    {
        cout << "Reading file " << inFileName << endl;

        AcesInputFile in (inFileName);

        h  = in.header ();
        dw = h.dataWindow ();

        width  = dw.max.x - dw.min.x + 1;
        height = dw.max.y - dw.min.y + 1;
        p.resizeErase (height, width);

        in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
        in.readPixels (dw.min.y, dw.max.y);
    }
}